

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void try_initialize_global_cpu_info(void)

{
  int *piVar1;
  __cpu_mask *p_Var2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  ulong uVar8;
  CpuSet *pCVar9;
  ulong uVar10;
  long lVar11;
  int i;
  int iVar12;
  int iVar13;
  uint __max_leaf;
  size_type __n;
  CpuSet *pCVar14;
  int i_1;
  bool bVar15;
  byte bVar16;
  uint in_XCR0;
  int freq_khz;
  int local_458;
  int local_454;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  vector<int,_std::allocator<int>_> thread_set;
  
  bVar16 = 0;
  if (g_cpu_info_initialized == '\0') {
    pFVar6 = fopen("/proc/cpuinfo","rb");
    if (pFVar6 == (FILE *)0x0) {
      g_cpucount = 1;
    }
    else {
      iVar12 = 0;
      while ((iVar4 = feof(pFVar6), iVar4 == 0 &&
             (pcVar7 = fgets((char *)&thread_set,0x400,pFVar6), pcVar7 != (char *)0x0))) {
        iVar4 = bcmp(&thread_set,"processor",9);
        iVar12 = iVar12 + (uint)(iVar4 == 0);
      }
      fclose(pFVar6);
      g_cpucount = 1;
      if (1 < iVar12) {
        g_cpucount = iVar12;
      }
    }
    thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar12 = 0;
    for (iVar4 = 0; iVar4 < g_cpucount; iVar4 = iVar4 + 1) {
      cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start._0_4_ = get_thread_siblings(iVar4);
      if ((int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != -1) {
        lVar11 = 0;
        do {
          if ((long)thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 == lVar11) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (&thread_set,(value_type_conflict1 *)&cpu_max_freq_khz);
            iVar12 = iVar12 + 1;
            break;
          }
          piVar1 = thread_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar11;
          lVar11 = lVar11 + 1;
        } while (*piVar1 !=
                 (int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      }
    }
    if (iVar12 == 0) {
      iVar12 = g_cpucount;
    }
    if (g_cpucount <= iVar12) {
      iVar12 = g_cpucount;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&thread_set.super__Vector_base<int,_std::allocator<int>_>);
    g_powersave = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[1] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[2] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[3] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[4] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[5] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[6] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[7] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[8] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[9] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[10] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xb] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xc] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xd] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xe] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xf] = 0;
    __n = (size_type)g_cpucount;
    uVar10 = 0;
    uVar8 = 0;
    g_physical_cpucount = iVar12;
    if (0 < g_cpucount) {
      uVar8 = (ulong)(uint)g_cpucount;
    }
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar10 < 0x400) {
        p_Var2 = g_cpu_affinity_mask_all.cpu_set.__bits + (uVar10 >> 6);
        *p_Var2 = *p_Var2 | 1L << ((byte)uVar10 & 0x3f);
      }
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&cpu_max_freq_khz,__n,(allocator_type *)&thread_set);
    iVar12 = 0x7fffffff;
    uVar8 = 0;
    iVar4 = 0;
    while( true ) {
      uVar10 = (ulong)g_cpucount;
      if ((long)uVar10 <= (long)uVar8) break;
      local_458 = iVar4;
      local_454 = iVar12;
      sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",
              uVar8 & 0xffffffff);
      pFVar6 = fopen((char *)&thread_set,"rb");
      if (pFVar6 == (FILE *)0x0) {
        sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",
                uVar8 & 0xffffffff);
        pFVar6 = fopen((char *)&thread_set,"rb");
        if (pFVar6 != (FILE *)0x0) {
          iVar12 = 0;
          do {
            iVar13 = iVar12;
            iVar12 = feof(pFVar6);
            if (iVar12 != 0) break;
            freq_khz = 0;
            iVar4 = __isoc99_fscanf(pFVar6,"%d %*d",&freq_khz);
            iVar12 = freq_khz;
            if (freq_khz <= iVar13) {
              iVar12 = iVar13;
            }
          } while (iVar4 == 1);
          fclose(pFVar6);
          if (iVar13 != 0) goto LAB_0013808d;
        }
        sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",
                uVar8 & 0xffffffff);
        pFVar6 = fopen((char *)&thread_set,"rb");
        iVar13 = -1;
        if (pFVar6 != (FILE *)0x0) {
          freq_khz = -1;
          uVar5 = __isoc99_fscanf(pFVar6,"%d",&freq_khz);
          if (uVar5 != 1) {
            fprintf(_stderr,"fscanf cpuinfo_max_freq error %d",(ulong)uVar5);
            fputc(10,_stderr);
          }
          fclose(pFVar6);
          iVar13 = freq_khz;
        }
      }
      else {
        iVar12 = 0;
        do {
          iVar13 = iVar12;
          iVar12 = feof(pFVar6);
          if (iVar12 != 0) break;
          freq_khz = 0;
          iVar4 = __isoc99_fscanf(pFVar6,"%d %*d",&freq_khz);
          iVar12 = freq_khz;
          if (freq_khz <= iVar13) {
            iVar12 = iVar13;
          }
        } while (iVar4 == 1);
        fclose(pFVar6);
      }
LAB_0013808d:
      *(int *)(CONCAT44(cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) + uVar8 * 4) = iVar13;
      iVar4 = local_458;
      if (local_458 < iVar13) {
        iVar4 = iVar13;
      }
      iVar12 = local_454;
      if (iVar13 < local_454) {
        iVar12 = iVar13;
      }
      uVar8 = uVar8 + 1;
    }
    iVar12 = (iVar12 + iVar4) / 2;
    if (iVar12 == iVar4) {
      g_cpu_affinity_mask_little.cpu_set.__bits[0xe] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xf] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xc] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xd] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[10] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0xb] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[8] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[9] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[6] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[7] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[4] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[5] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[2] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[3] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[0] = 0;
      g_cpu_affinity_mask_little.cpu_set.__bits[1] = 0;
      pCVar9 = &g_cpu_affinity_mask_all;
      pCVar14 = &g_cpu_affinity_mask_big;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pCVar14->cpu_set).__bits[0] = (pCVar9->cpu_set).__bits[0];
        pCVar9 = (CpuSet *)((long)pCVar9 + ((ulong)bVar16 * -2 + 1) * 8);
        pCVar14 = (CpuSet *)((long)pCVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      }
    }
    else {
      for (uVar8 = 0; (long)uVar8 < (long)(int)uVar10; uVar8 = uVar8 + 1) {
        sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/topology/core_cpus_list",
                uVar8 & 0xffffffff);
        pFVar6 = fopen((char *)&thread_set,"rb");
        if (pFVar6 == (FILE *)0x0) {
          sprintf((char *)&thread_set,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",
                  uVar8 & 0xffffffff);
          pFVar6 = fopen((char *)&thread_set,"rb");
          if (pFVar6 != (FILE *)0x0) goto LAB_00138309;
LAB_00138345:
          pCVar9 = &g_cpu_affinity_mask_big;
          if (*(int *)(CONCAT44(cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start) + uVar8 * 4) < iVar12
             ) {
            pCVar9 = &g_cpu_affinity_mask_little;
          }
        }
        else {
LAB_00138309:
          do {
            iVar4 = feof(pFVar6);
            if (iVar4 != 0) {
              fclose(pFVar6);
              goto LAB_00138345;
            }
            uVar5 = fgetc(pFVar6);
          } while ((uVar5 & 0xfe) != 0x2c);
          fclose(pFVar6);
          pCVar9 = &g_cpu_affinity_mask_big;
        }
        if (uVar8 < 0x400) {
          p_Var2 = (pCVar9->cpu_set).__bits + (uVar8 >> 6);
          *p_Var2 = *p_Var2 | 1L << ((byte)uVar8 & 0x3f);
        }
        uVar10 = (ulong)(uint)g_cpucount;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&cpu_max_freq_khz.super__Vector_base<int,_std::allocator<int>_>);
    get_elf_hwcap(0x10);
    get_elf_hwcap(0x1a);
    g_cpu_support_x86_fma = 0;
    puVar3 = (uint *)cpuid_basic_info(0);
    uVar5 = *puVar3;
    if ((int)uVar5 < 1) {
      g_cpu_support_x86_avx = 0;
      bVar15 = true;
    }
    else {
      lVar11 = cpuid_Version_info(1);
      if ((~*(uint *)(lVar11 + 0xc) & 0x1c000000) == 0) {
        g_cpu_support_x86_fma = 0;
        g_cpu_support_x86_avx = (int)((in_XCR0 & 6) == 6);
        bVar15 = true;
        if (6 < uVar5) {
          g_cpu_support_x86_fma = *(uint *)(lVar11 + 0xc) & 0x1000;
          bVar15 = false;
          if ((in_XCR0 & 6) != 6) {
            g_cpu_support_x86_fma = 0;
          }
        }
      }
      else {
        g_cpu_support_x86_avx = 0;
        bVar15 = uVar5 < 7;
        g_cpu_support_x86_fma = 0;
      }
    }
    puVar3 = (uint *)cpuid(0x80000000);
    g_cpu_support_x86_f16c = 0;
    g_cpu_support_x86_xop = 0;
    if (0x80000000 < *puVar3) {
      lVar11 = cpuid(0x80000001);
      g_cpu_support_x86_xop = *(uint *)(lVar11 + 0xc) & 0x800;
    }
    if (0 < (int)uVar5) {
      lVar11 = cpuid_Version_info(1);
      g_cpu_support_x86_f16c = *(uint *)(lVar11 + 0xc) & 0x20000000;
    }
    if ((bVar15) || (lVar11 = cpuid_Version_info(1), (~*(uint *)(lVar11 + 0xc) & 0x1c000000) != 0))
    {
      g_cpu_support_x86_avx2 = 0;
      g_cpu_support_x86_avx_vnni = 0;
      g_cpu_support_x86_avx_vnni_int8 = 0;
      g_cpu_support_x86_avx_vnni_int16 = 0;
      g_cpu_support_x86_avx_ne_convert = 0;
      g_cpu_support_x86_avx512 = 0;
      g_cpu_support_x86_avx512_vnni = 0;
      g_cpu_support_x86_avx512_bf16 = 0;
      g_cpu_support_x86_avx512_fp16 = 0;
    }
    else {
      g_cpu_support_x86_avx512 = 0;
      g_cpu_support_x86_avx2 = 0;
      g_cpu_support_x86_avx_vnni = 0;
      g_cpu_support_x86_avx_vnni_int8 = 0;
      g_cpu_support_x86_avx_vnni_int16 = 0;
      g_cpu_support_x86_avx_ne_convert = 0;
      if ((in_XCR0 & 6) == 6) {
        lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx2 = *(uint *)(lVar11 + 4) & 0x20;
        puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        uVar5 = puVar3[2];
        g_cpu_support_x86_avx_vnni = *puVar3 & 0x10;
        g_cpu_support_x86_avx_vnni_int8 = uVar5 & 0x10;
        g_cpu_support_x86_avx_vnni_int16 = uVar5 & 0x400;
        g_cpu_support_x86_avx_ne_convert = uVar5 & 0x20;
      }
      g_cpu_support_x86_avx512_vnni = 0;
      if ((in_XCR0 & 0xe6) == 0xe6) {
        lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512 = *(uint *)(lVar11 + 4) >> 0x1f;
        if ((~*(uint *)(lVar11 + 4) & 0x50030000) != 0) {
          g_cpu_support_x86_avx512 = 0;
        }
        g_cpu_support_x86_avx512_vnni = *(uint *)(lVar11 + 0xc) & 0x800;
      }
      g_cpu_support_x86_avx512_fp16 = 0;
      g_cpu_support_x86_avx512_bf16 = 0;
      if ((in_XCR0 & 6) == 6) {
        puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_bf16 = *puVar3 & 0x20;
      }
      if ((in_XCR0 & 0xe6) == 0xe6) {
        lVar11 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_fp16 = *(uint *)(lVar11 + 8) & 0x800000;
      }
    }
    iVar12 = get_big_cpu_data_cache_size(2);
    if (iVar12 < 1) {
      lVar11 = sysconf(0xbf);
      iVar12 = (int)lVar11;
      if ((int)lVar11 < 1) {
        iVar4 = 0x40000;
        if (g_cpu_support_x86_avx2 == 0) {
          iVar4 = (uint)(g_cpu_support_x86_avx != 0) * 0x10000 + 0x10000;
        }
        iVar12 = 0x100000;
        if (g_cpu_support_x86_avx512 == 0) {
          iVar12 = iVar4;
        }
      }
    }
    g_cpu_level2_cachesize = iVar12;
    iVar12 = get_big_cpu_data_cache_size(3);
    if (iVar12 < 1) {
      lVar11 = sysconf(0xc2);
      iVar12 = (int)lVar11;
    }
    g_cpu_info_initialized = '\x01';
    g_cpu_level3_cachesize = iVar12;
  }
  return;
}

Assistant:

static inline void try_initialize_global_cpu_info()
{
    if (!g_cpu_info_initialized)
    {
        initialize_global_cpu_info();
        g_cpu_info_initialized = 1;
    }
}